

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall ieee754::mantissa_msb_index(ieee754 *this)

{
  ieee754 *this_local;
  int local_4;
  
  if (this->ebits < 8) {
    local_4 = this->bytes + -1;
  }
  else if (this->ebits < 0x10) {
    local_4 = this->bytes + -2;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mantissa_msb_index() const
    {
        if (ebits <= 7)
            return bytes - 1;
        else if (ebits <= 15)
            return bytes - 2;
        else
        {
            assert(FALSE);
            return 0;
        }
    }